

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SPxBasisBase(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,TYPE ttype)

{
  Timer *pTVar1;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  type *in_stack_fffffffffffffee0;
  double in_stack_fffffffffffffee8;
  cpp_dec_float<100U,_int,_void> *this_00;
  undefined4 in_stack_ffffffffffffff00;
  TYPE ttype_00;
  undefined8 local_e8;
  undefined4 local_dc;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8 [3];
  undefined4 local_ac;
  undefined8 local_a0;
  undefined8 *local_98;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 *local_80;
  undefined8 *local_78;
  undefined8 local_70;
  undefined8 *local_68;
  undefined8 *local_60;
  undefined8 local_58;
  undefined8 *local_50;
  undefined8 *local_48;
  undefined8 local_40;
  undefined4 *local_38;
  long local_30;
  undefined4 *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  *in_RDI = &PTR_change_0089ca38;
  in_RDI[1] = 0;
  this_00 = (cpp_dec_float<100U,_int,_void> *)(in_RDI + 2);
  ttype_00 = OFF;
  local_ac = in_ESI;
  DataArray<soplex::SPxId>::DataArray
            ((DataArray<soplex::SPxId> *)this_00,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             SUB84(in_stack_fffffffffffffee8,0),(Real)in_stack_fffffffffffffee0);
  DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
  ::DataArray((DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
               *)this_00,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
              SUB84(in_stack_fffffffffffffee8,0),(Real)in_stack_fffffffffffffee0);
  *(undefined1 *)(in_RDI + 8) = 0;
  in_RDI[9] = 0;
  *(undefined1 *)(in_RDI + 10) = 0;
  *(undefined4 *)((long)in_RDI + 0x54) = 200;
  local_90 = in_RDI + 0xb;
  local_c8[0] = 0x4024000000000000;
  local_98 = local_c8;
  local_a0 = 0;
  local_8 = local_98;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (this_00,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  local_78 = in_RDI + 0x15;
  local_d0 = 0x4014000000000000;
  local_80 = &local_d0;
  local_88 = 0;
  local_10 = local_80;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (this_00,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  local_60 = in_RDI + 0x1f;
  local_d8 = 0x3ff8000000000000;
  local_68 = &local_d8;
  local_70 = 0;
  local_18 = local_68;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (this_00,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  *(undefined4 *)(in_RDI + 0x29) = 0;
  *(undefined4 *)((long)in_RDI + 0x14c) = 0;
  *(undefined4 *)(in_RDI + 0x2a) = 0;
  *(undefined4 *)((long)in_RDI + 0x154) = 0;
  *(undefined4 *)(in_RDI + 0x2b) = 0;
  *(undefined4 *)((long)in_RDI + 0x15c) = 1;
  *(undefined4 *)(in_RDI + 0x2c) = 0;
  local_30 = (long)in_RDI + 0x164;
  local_dc = 0;
  local_38 = &local_dc;
  local_40 = 0;
  local_28 = local_38;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (this_00,(longlong)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  *(undefined4 *)((long)in_RDI + 0x1b4) = 0;
  in_RDI[0x37] = 0;
  *(undefined4 *)(in_RDI + 0x38) = local_ac;
  SPxId::SPxId((SPxId *)0x4ae6da);
  SPxId::SPxId((SPxId *)0x4ae6ed);
  *(undefined4 *)((long)in_RDI + 0x1d4) = 0;
  local_48 = in_RDI + 0x3b;
  local_e8 = 0;
  local_50 = &local_e8;
  local_58 = 0;
  local_20 = local_50;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (this_00,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  *(undefined4 *)(in_RDI + 0x45) = 0xfffffffe;
  Desc::Desc((Desc *)CONCAT44(ttype_00,in_stack_ffffffffffffff00));
  *(undefined1 *)(in_RDI + 0x4e) = 0;
  in_RDI[0x4f] = 0;
  pTVar1 = TimerFactory::createTimer(ttype_00);
  in_RDI[0x37] = pTVar1;
  return;
}

Assistant:

SPxBasisBase<R>::SPxBasisBase(Timer::TYPE ttype)
   : theLP(nullptr)
   , matrixIsSetup(false)
   , factor(nullptr)
   , factorized(false)
   , maxUpdates(200)
   , nonzeroFactor(10.0)
   , fillFactor(5.0)
   , memFactor(1.5)
   , iterCount(0)
   , lastIterCount(0)
   , iterDegenCheck(0)
   , updateCount(0)
   , totalUpdateCount(0)
   , nzCount(1)
   , lastMem(0)
   , lastFill(0)
   , lastNzCount(0)
   , theTime(nullptr)
   , timerType(ttype)
   , lastidx(0)
   , minStab(0.0)
   , thestatus(NO_PROBLEM)
   , freeSlinSolver(false)
   , spxout(nullptr)
{
   // info: is not consistent at this moment, e.g. because theLP == 0

   theTime = TimerFactory::createTimer(timerType);
}